

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> * __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::operator=
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  TPZManVector<TFad<6,_double>,_3> *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (this != copy) {
    uVar7 = (copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements;
    lVar5 = (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc;
    if ((lVar5 < (long)uVar7) &&
       (pTVar4 = (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore,
       pTVar4 != this->fExtAlloc && pTVar4 != (TPZManVector<TFad<6,_double>,_3> *)0x0)) {
      dVar1 = pTVar4[-1].fExtAlloc[2].dx_[5];
      if (dVar1 != 0.0) {
        lVar5 = (long)dVar1 * 0xe0;
        do {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_3> *)
                     ((long)pTVar4[-1].fExtAlloc[0].dx_ + lVar5 + -0x30));
          lVar5 = lVar5 + -0xe0;
        } while (lVar5 != 0);
      }
      operator_delete__(pTVar4[-1].fExtAlloc[2].dx_ + 5,(long)dVar1 * 0xe0 | 8);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
           (TPZManVector<TFad<6,_double>,_3> *)0x0;
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
      lVar5 = 0;
    }
    if ((long)uVar7 < 4) {
      pTVar4 = (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore;
      if (pTVar4 != (TPZManVector<TFad<6,_double>,_3> *)0x0 && pTVar4 != this->fExtAlloc) {
        dVar1 = pTVar4[-1].fExtAlloc[2].dx_[5];
        if (dVar1 != 0.0) {
          lVar5 = (long)dVar1 * 0xe0;
          do {
            TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                      ((TPZManVector<TFad<6,_double>,_3> *)
                       ((long)pTVar4[-1].fExtAlloc[0].dx_ + lVar5 + -0x30));
            lVar5 = lVar5 + -0xe0;
          } while (lVar5 != 0);
        }
        operator_delete__(pTVar4[-1].fExtAlloc[2].dx_ + 5,(long)dVar1 * 0xe0 | 8);
      }
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = this->fExtAlloc;
    }
    else if (lVar5 < (long)uVar7) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0xe0),8) == 0) {
        uVar6 = SUB168(auVar2 * ZEXT816(0xe0),0) | 8;
      }
      puVar3 = (ulong *)operator_new__(uVar6);
      *puVar3 = uVar7;
      lVar5 = 0;
      pTVar4 = (TPZManVector<TFad<6,_double>,_3> *)(puVar3 + 1);
      do {
        TPZManVector<TFad<6,_double>,_3>::TPZManVector(pTVar4,0);
        lVar5 = lVar5 + -0xe0;
        pTVar4 = pTVar4 + 1;
      } while (uVar7 * -0xe0 - lVar5 != 0);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
           (TPZManVector<TFad<6,_double>,_3> *)(puVar3 + 1);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = uVar7;
    }
    (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = uVar7;
    uVar6 = 0;
    if ((long)uVar7 < 1) {
      uVar7 = uVar6;
    }
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      TPZManVector<TFad<6,_double>,_3>::operator=
                ((TPZManVector<TFad<6,_double>,_3> *)
                 ((long)((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc
                        [0].dx_ + (uVar6 - 0x30)),
                 (TPZManVector<TFad<6,_double>,_3> *)
                 ((long)((copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc
                        [0].dx_ + (uVar6 - 0x30)));
      uVar6 = uVar6 + 0xe0;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}